

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::SharedDtor(NeuralNetworkPreprocessing *this)

{
  bool bVar1;
  string *default_value;
  NeuralNetworkPreprocessing *this_local;
  
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->featurename_,default_value);
  bVar1 = has_preprocessor(this);
  if (bVar1) {
    clear_preprocessor(this);
  }
  return;
}

Assistant:

void NeuralNetworkPreprocessing::SharedDtor() {
  featurename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (has_preprocessor()) {
    clear_preprocessor();
  }
}